

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprPopulatePoslistsCb
              (void *pCtx,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  long lVar1;
  char *__s;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  byte bVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  int local_44;
  
  lVar1 = *pCtx;
  iVar8 = 0x8000;
  if (nToken < 0x8000) {
    iVar8 = nToken;
  }
  if ((tflags & 1U) == 0) {
    *(long *)((long)pCtx + 0x10) = *(long *)((long)pCtx + 0x10) + 1;
  }
  if (0 < *(int *)(lVar1 + 0x1c)) {
    lVar7 = 0;
    do {
      if (*(int *)(*(long *)((long)pCtx + 8) + 8 + lVar7 * 0x10) == 0) {
        bVar2 = 0;
      }
      else {
        pcVar6 = (char *)(*(long *)(*(long *)(lVar1 + 0x20) + lVar7 * 8) + 0x20);
        do {
          __s = *(char **)(pcVar6 + 8);
          sVar4 = strlen(__s);
          iVar3 = (int)sVar4;
          if ((iVar8 == iVar3) || ((bVar5 = 0, iVar3 < iVar8 && (*pcVar6 != '\0')))) {
            iVar3 = bcmp(__s,pToken,(long)iVar3);
            bVar5 = 0;
            if (iVar3 == 0) {
              iVar3 = sqlite3Fts5PoslistWriterAppend
                                ((Fts5Buffer *)(*(long *)(*(long *)(lVar1 + 0x20) + lVar7 * 8) + 8),
                                 (Fts5PoslistWriter *)(*(long *)((long)pCtx + 8) + lVar7 * 0x10),
                                 *(i64 *)((long)pCtx + 0x10));
              bVar5 = (iVar3 == 0) * '\x04' + 1;
              if (iVar3 != 0) {
                local_44 = iVar3;
              }
            }
          }
          bVar2 = 0;
          if (bVar5 != 0) {
            if (bVar5 != 5) {
              bVar2 = bVar5;
            }
            break;
          }
          pcVar6 = *(char **)(pcVar6 + 0x18);
        } while (pcVar6 != (char *)0x0);
      }
      if ((bVar2 & 3) != 0) {
        return local_44;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)(lVar1 + 0x1c));
  }
  return 0;
}

Assistant:

static int fts5ExprPopulatePoslistsCb(
  void *pCtx,                /* Copy of 2nd argument to xTokenize() */
  int tflags,                /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,        /* Pointer to buffer containing token */
  int nToken,                /* Size of token in bytes */
  int iUnused1,              /* Byte offset of token within input text */
  int iUnused2               /* Byte offset of end of token within input text */
){
  Fts5ExprCtx *p = (Fts5ExprCtx*)pCtx;
  Fts5Expr *pExpr = p->pExpr;
  int i;

  UNUSED_PARAM2(iUnused1, iUnused2);

  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 ) p->iOff++;
  for(i=0; i<pExpr->nPhrase; i++){
    Fts5ExprTerm *pTerm;
    if( p->aPopulator[i].bOk==0 ) continue;
    for(pTerm=&pExpr->apExprPhrase[i]->aTerm[0]; pTerm; pTerm=pTerm->pSynonym){
      int nTerm = (int)strlen(pTerm->zTerm);
      if( (nTerm==nToken || (nTerm<nToken && pTerm->bPrefix))
       && memcmp(pTerm->zTerm, pToken, nTerm)==0
      ){
        int rc = sqlite3Fts5PoslistWriterAppend(
            &pExpr->apExprPhrase[i]->poslist, &p->aPopulator[i].writer, p->iOff
        );
        if( rc ) return rc;
        break;
      }
    }
  }
  return SQLITE_OK;
}